

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

QSize __thiscall
QIconLoaderEngine::actualSize(QIconLoaderEngine *this,QSize *size,Mode mode,State state)

{
  QIconLoaderEngineEntry *size_00;
  int *b;
  undefined4 in_ECX;
  undefined4 in_EDX;
  QSize *in_RSI;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int result;
  QIconDirInfo *dir;
  QIconLoaderEngineEntry *entry;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QSize *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QIconDirInfo *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_20;
  int local_1c [3];
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  size_00 = entryForSize((QThemeIconInfo *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI,
                         (int)((ulong)in_RSI >> 0x20));
  if (size_00 == (QIconLoaderEngineEntry *)0x0) {
    QSize::QSize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  }
  else {
    this_00 = &size_00->dir;
    if ((size_00->dir).type == Scalable) {
      local_10 = *in_RSI;
    }
    else if ((size_00->dir).type == Fallback) {
      QIcon::QIcon((QIcon *)this_00,
                   (QString *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      local_10 = QIcon::actualSize((QIcon *)CONCAT44(in_EDX,in_ECX),(QSize *)size_00,
                                   (Mode)((ulong)this_00 >> 0x20),(State)this_00);
      QIcon::~QIcon((QIcon *)in_stack_ffffffffffffffa0);
    }
    else {
      local_1c[0] = (int)(size_00->dir).size * (int)(size_00->dir).scale;
      local_20 = QSize::width((QSize *)0x2a36aa);
      QSize::height((QSize *)0x2a36b8);
      b = qMin<int>(&local_20,(int *)&stack0xffffffffffffffdc);
      qMin<int>(local_1c,b);
      QSize::QSize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QIconLoaderEngine::actualSize(const QSize &size, QIcon::Mode mode,
                                   QIcon::State state)
{
    Q_UNUSED(mode);
    Q_UNUSED(state);

    QIconLoaderEngineEntry *entry = entryForSize(m_info, size);
    if (entry) {
        const QIconDirInfo &dir = entry->dir;
        if (dir.type == QIconDirInfo::Scalable) {
            return size;
        } else if (dir.type == QIconDirInfo::Fallback) {
            return QIcon(entry->filename).actualSize(size, mode, state);
        } else {
            int result = qMin<int>(dir.size * dir.scale, qMin(size.width(), size.height()));
            return QSize(result, result);
        }
    }
    return QSize(0, 0);
}